

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::KNearestNeighborsClassifier::MergeFrom
          (KNearestNeighborsClassifier *this,KNearestNeighborsClassifier *from)

{
  bool bVar1;
  ClassLabelsCase CVar2;
  DefaultClassLabelCase DVar3;
  WeightingSchemeCase WVar4;
  LogMessage *other;
  NearestNeighborsIndex *this_00;
  NearestNeighborsIndex *from_00;
  Int64Parameter *this_01;
  Int64Parameter *from_01;
  StringVector *this_02;
  StringVector *from_02;
  Int64Vector *this_03;
  Int64Vector *from_03;
  string *value;
  int64 value_00;
  UniformWeighting *this_04;
  UniformWeighting *from_04;
  InverseDistanceWeighting *this_05;
  InverseDistanceWeighting *from_05;
  InternalMetadataWithArenaLite *this_06;
  LogFinisher local_a5;
  uint32 cached_has_bits;
  byte local_91;
  LogMessage local_90;
  KNearestNeighborsClassifier *local_58;
  KNearestNeighborsClassifier *from_local;
  KNearestNeighborsClassifier *this_local;
  InternalMetadataWithArenaLite *local_40;
  InternalMetadataWithArenaLite *local_38;
  InternalMetadataWithArenaLite *local_30;
  InternalMetadataWithArenaLite *local_28;
  Container *local_20;
  InternalMetadataWithArenaLite *local_18;
  InternalMetadataWithArenaLite *local_10;
  
  local_91 = 0;
  local_58 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O0/mlmodel/format/NearestNeighbors.pb.cc"
               ,0x260);
    local_91 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_90,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_a5,other);
  }
  if ((local_91 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_90);
  }
  this_06 = &this->_internal_metadata_;
  this_local = (KNearestNeighborsClassifier *)&local_58->_internal_metadata_;
  local_40 = this_06;
  local_38 = (InternalMetadataWithArenaLite *)this_local;
  local_30 = (InternalMetadataWithArenaLite *)this_local;
  if (((uint)(((InternalMetadataWithArenaLite *)this_local)->
             super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
             ).ptr_ & 1) == 1) {
    local_28 = (InternalMetadataWithArenaLite *)this_local;
    local_18 = (InternalMetadataWithArenaLite *)this_local;
    local_10 = (InternalMetadataWithArenaLite *)this_local;
    if (((uint)(((InternalMetadataWithArenaLite *)this_local)->
               super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
               ).ptr_ & 1) == 1) {
      local_20 = google::protobuf::internal::
                 InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                           ((InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                             *)this_local);
    }
    else {
      local_20 = (Container *)
                 google::protobuf::internal::InternalMetadataWithArenaLite::
                 default_instance_abi_cxx11_();
    }
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (this_06,&local_20->unknown_fields);
  }
  bVar1 = has_nearestneighborsindex(local_58);
  if (bVar1) {
    this_00 = mutable_nearestneighborsindex(this);
    from_00 = nearestneighborsindex(local_58);
    NearestNeighborsIndex::MergeFrom(this_00,from_00);
  }
  bVar1 = has_numberofneighbors(local_58);
  if (bVar1) {
    this_01 = mutable_numberofneighbors(this);
    from_01 = numberofneighbors(local_58);
    Int64Parameter::MergeFrom(this_01,from_01);
  }
  CVar2 = ClassLabels_case(local_58);
  if (CVar2 != CLASSLABELS_NOT_SET) {
    if (CVar2 == kStringClassLabels) {
      this_02 = mutable_stringclasslabels(this);
      from_02 = stringclasslabels(local_58);
      StringVector::MergeFrom(this_02,from_02);
    }
    else if (CVar2 == kInt64ClassLabels) {
      this_03 = mutable_int64classlabels(this);
      from_03 = int64classlabels(local_58);
      Int64Vector::MergeFrom(this_03,from_03);
    }
  }
  DVar3 = DefaultClassLabel_case(local_58);
  if (DVar3 != DEFAULTCLASSLABEL_NOT_SET) {
    if (DVar3 == kDefaultStringLabel) {
      value = defaultstringlabel_abi_cxx11_(local_58);
      set_defaultstringlabel(this,value);
    }
    else if (DVar3 == kDefaultInt64Label) {
      value_00 = defaultint64label(local_58);
      set_defaultint64label(this,value_00);
    }
  }
  WVar4 = WeightingScheme_case(local_58);
  if (WVar4 != WEIGHTINGSCHEME_NOT_SET) {
    if (WVar4 == kUniformWeighting) {
      this_04 = mutable_uniformweighting(this);
      from_04 = uniformweighting(local_58);
      UniformWeighting::MergeFrom(this_04,from_04);
    }
    else if (WVar4 == kInverseDistanceWeighting) {
      this_05 = mutable_inversedistanceweighting(this);
      from_05 = inversedistanceweighting(local_58);
      InverseDistanceWeighting::MergeFrom(this_05,from_05);
    }
  }
  return;
}

Assistant:

void KNearestNeighborsClassifier::MergeFrom(const KNearestNeighborsClassifier& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.KNearestNeighborsClassifier)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.has_nearestneighborsindex()) {
    mutable_nearestneighborsindex()->::CoreML::Specification::NearestNeighborsIndex::MergeFrom(from.nearestneighborsindex());
  }
  if (from.has_numberofneighbors()) {
    mutable_numberofneighbors()->::CoreML::Specification::Int64Parameter::MergeFrom(from.numberofneighbors());
  }
  switch (from.ClassLabels_case()) {
    case kStringClassLabels: {
      mutable_stringclasslabels()->::CoreML::Specification::StringVector::MergeFrom(from.stringclasslabels());
      break;
    }
    case kInt64ClassLabels: {
      mutable_int64classlabels()->::CoreML::Specification::Int64Vector::MergeFrom(from.int64classlabels());
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
  switch (from.DefaultClassLabel_case()) {
    case kDefaultStringLabel: {
      set_defaultstringlabel(from.defaultstringlabel());
      break;
    }
    case kDefaultInt64Label: {
      set_defaultint64label(from.defaultint64label());
      break;
    }
    case DEFAULTCLASSLABEL_NOT_SET: {
      break;
    }
  }
  switch (from.WeightingScheme_case()) {
    case kUniformWeighting: {
      mutable_uniformweighting()->::CoreML::Specification::UniformWeighting::MergeFrom(from.uniformweighting());
      break;
    }
    case kInverseDistanceWeighting: {
      mutable_inversedistanceweighting()->::CoreML::Specification::InverseDistanceWeighting::MergeFrom(from.inversedistanceweighting());
      break;
    }
    case WEIGHTINGSCHEME_NOT_SET: {
      break;
    }
  }
}